

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_tls_accept(intptr_t uuid,void *tls,void *udata)

{
  if (0 < FIO_LOG_LEVEL) {
    FIO_LOG2STDERR("FATAL: No supported SSL/TLS library available.");
  }
  exit(-1);
}

Assistant:

void FIO_TLS_WEAK fio_tls_accept(intptr_t uuid, void *tls, void *udata) {
  FIO_LOG_FATAL("No supported SSL/TLS library available.");
  exit(-1);
  return;
  (void)uuid;
  (void)tls;
  (void)udata;
}